

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

FunctionLookupChain * __thiscall
anon_unknown.dwarf_9c70f::FunctionLookupChain::next
          (FunctionLookupChain *__return_storage_ptr__,FunctionLookupChain *this)

{
  Node *pNVar1;
  ScopeData *pSVar2;
  Node *start;
  FunctionData *pFVar3;
  FunctionData *pFVar4;
  NodeIterator NVar5;
  
  pNVar1 = (this->node).node;
  if (pNVar1 == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x28e,"FunctionLookupChain (anonymous namespace)::FunctionLookupChain::next()");
  }
  pFVar3 = (FunctionData *)(this->node).start;
  pFVar4 = *(FunctionData **)(pNVar1 + 0x18);
  if (pFVar4 != pFVar3) {
    pSVar2 = this->scope;
    do {
      if (pFVar4 == (FunctionData *)0x0) break;
      if (*(int *)&((Node *)&pFVar4->source)->start == *(int *)pNVar1) {
        if (pFVar4->importModule == (ModuleData *)0x0) {
          (__return_storage_ptr__->node).start = (Node *)pFVar3;
          (__return_storage_ptr__->node).node = (Node *)pFVar4;
          __return_storage_ptr__->scope = pSVar2;
          return (FunctionLookupChain *)pFVar3;
        }
        goto LAB_00160110;
      }
      pFVar4 = (FunctionData *)pFVar4->scope;
    } while (pFVar4 != pFVar3);
  }
  do {
    pFVar3 = (FunctionData *)this->scope;
    if ((pFVar3 == (FunctionData *)0x0) ||
       (pSVar2 = (ScopeData *)((Node *)&pFVar3->source)->start, pSVar2 == (ScopeData *)0x0))
    goto LAB_00160110;
    this->scope = pSVar2;
    NVar5 = DirectChainedMap<IdentifierLookupResult>::first
                      (&pSVar2->idLookupMap,*(uint *)(this->node).node);
    pFVar3 = (FunctionData *)NVar5.start;
  } while (NVar5.node == (Node *)0x0);
  if (*(long *)(NVar5.node + 8) == 0) {
    pSVar2 = this->scope;
    (__return_storage_ptr__->node).start = NVar5.start;
    (__return_storage_ptr__->node).node = NVar5.node;
    __return_storage_ptr__->scope = pSVar2;
  }
  else {
LAB_00160110:
    (__return_storage_ptr__->node).start = (Node *)0x0;
    (__return_storage_ptr__->node).node = (Node *)0x0;
    __return_storage_ptr__->scope = (ScopeData *)0x0;
  }
  return (FunctionLookupChain *)pFVar3;
}

Assistant:

FunctionLookupChain next()
		{
			assert(node);

			// Try the next variable in current scope
			if(Node curr = scope->idLookupMap.next(node))
			{
				// Scopes with mixed variables and functions will block function overload visibility
				if(curr.node->value.variable)
					return FunctionLookupChain();

				return FunctionLookupChain(curr, scope);
			}

			// Search in next scopes
			while(scope && scope->scope)
			{
				scope = scope->scope;

				if(Node curr = scope->idLookupMap.first(node.node->hash))
				{
					// Scopes with mixed variables and functions will block function overload visibility
					if(curr.node->value.variable)
						return FunctionLookupChain();

					return FunctionLookupChain(curr, scope);
				}
			}

			return FunctionLookupChain();
		}